

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void cmac_gfmul(uint8_t *block)

{
  uint8_t uVar1;
  byte bVar2;
  int local_18;
  uint8_t x;
  int i;
  uint8_t carry;
  uint8_t *block_local;
  
  x = '\0';
  for (local_18 = 0xf; -1 < local_18; local_18 = local_18 + -1) {
    uVar1 = block[local_18];
    block[local_18] = block[local_18] << 1 | (byte)((int)(uint)x >> 7);
    x = uVar1;
  }
  bVar2 = 0;
  if ((x & 0x80) != 0) {
    bVar2 = 0x87;
  }
  block[0xf] = block[0xf] ^ bVar2;
  return;
}

Assistant:

static void cmac_gfmul(uint8_t* block)
{
    uint8_t carry = 0;
    for (int i = 15; i >= 0; i--)
    {
        uint8_t x = block[i];
        block[i] = (block[i] << 1) | (carry >> 7);
        carry = x;
    }

    block[15] ^= (carry & 0x80 ? 0x87 : 0);
}